

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int CVodeReInit(void *cvode_mem,sunrealtype t0,N_Vector y0)

{
  long in_RSI;
  CVodeMem in_RDI;
  sunrealtype in_XMM0_Qa;
  int k;
  int i;
  CVodeMem cv_mem;
  int local_30;
  int local_2c;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x380,"CVodeReInit",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_MallocDone == 0) {
    cvProcessError(in_RDI,-0x17,0x38b,"CVodeReInit",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"Attempt to call before CVodeInit.");
    local_4 = -0x17;
  }
  else if (in_RSI == 0) {
    cvProcessError(in_RDI,-0x16,0x395,"CVodeReInit",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"y0 = NULL illegal.");
    local_4 = -0x16;
  }
  else {
    in_RDI->cv_tn = in_XMM0_Qa;
    in_RDI->cv_q = 1;
    in_RDI->cv_L = 2;
    in_RDI->cv_qwait = in_RDI->cv_L;
    in_RDI->cv_etamax = in_RDI->cv_eta_max_fs;
    in_RDI->cv_qu = 0;
    in_RDI->cv_hu = 0.0;
    in_RDI->cv_tolsf = 1.0;
    in_RDI->cv_forceSetup = 0;
    N_VScale(0x3ff0000000000000,in_RSI,in_RDI->cv_zn[0]);
    in_RDI->cv_nst = 0;
    in_RDI->cv_nfe = 0;
    in_RDI->cv_ncfn = 0;
    in_RDI->cv_netf = 0;
    in_RDI->cv_nni = 0;
    in_RDI->cv_nnf = 0;
    in_RDI->cv_nsetups = 0;
    in_RDI->cv_nhnil = 0;
    in_RDI->cv_nstlp = 0;
    in_RDI->cv_nscon = 0;
    in_RDI->cv_nge = 0;
    in_RDI->cv_irfnd = 0;
    in_RDI->cv_h0u = 0.0;
    in_RDI->cv_next_h = 0.0;
    in_RDI->cv_next_q = 0;
    in_RDI->cv_nor = 0;
    for (local_2c = 1; local_2c < 6; local_2c = local_2c + 1) {
      for (local_30 = 1; local_30 < 4; local_30 = local_30 + 1) {
        in_RDI->cv_ssdat[local_2c + -1][local_30 + -1] = 0.0;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeReInit(void* cvode_mem, sunrealtype t0, N_Vector y0)
{
  CVodeMem cv_mem;
  int i, k;

  /* Check cvode_mem */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  /* Check if cvode_mem was allocated */

  if (cv_mem->cv_MallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_MALLOC, __LINE__, __func__, __FILE__,
                   MSGCV_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_NO_MALLOC);
  }

  /* Check for legal input parameters */

  if (y0 == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_Y0);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_ILL_INPUT);
  }

  /* Copy the input parameters into CVODES state */

  cv_mem->cv_tn = t0;

  /* Set step parameters */

  cv_mem->cv_q      = 1;
  cv_mem->cv_L      = 2;
  cv_mem->cv_qwait  = cv_mem->cv_L;
  cv_mem->cv_etamax = cv_mem->cv_eta_max_fs;

  cv_mem->cv_qu    = 0;
  cv_mem->cv_hu    = ZERO;
  cv_mem->cv_tolsf = ONE;

  /* Set forceSetup to SUNFALSE */

  cv_mem->cv_forceSetup = SUNFALSE;

  /* Initialize zn[0] in the history array */

  N_VScale(ONE, y0, cv_mem->cv_zn[0]);

  /* Initialize all the counters */

  cv_mem->cv_nst     = 0;
  cv_mem->cv_nfe     = 0;
  cv_mem->cv_ncfn    = 0;
  cv_mem->cv_netf    = 0;
  cv_mem->cv_nni     = 0;
  cv_mem->cv_nnf     = 0;
  cv_mem->cv_nsetups = 0;
  cv_mem->cv_nhnil   = 0;
  cv_mem->cv_nstlp   = 0;
  cv_mem->cv_nscon   = 0;
  cv_mem->cv_nge     = 0;

  cv_mem->cv_irfnd = 0;

  /* Initialize other integrator optional outputs */

  cv_mem->cv_h0u    = ZERO;
  cv_mem->cv_next_h = ZERO;
  cv_mem->cv_next_q = 0;

  /* Initialize Stablilty Limit Detection data */

  cv_mem->cv_nor = 0;
  for (i = 1; i <= 5; i++)
  {
    for (k = 1; k <= 3; k++) { cv_mem->cv_ssdat[i - 1][k - 1] = ZERO; }
  }

  /* Problem has been successfully re-initialized */

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (CV_SUCCESS);
}